

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::iterate(FunctionalTest20_21 *this)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  RenderContext *pRVar4;
  NotSupportedError *this_00;
  char *description;
  program **pppVar5;
  long lVar6;
  program program;
  program *program_pointers [5];
  program fragment_program;
  program geometry_program;
  program tesselation_evaluation_program;
  program tesselation_control_program;
  program pStack_2b8;
  program *local_288;
  program *local_280;
  program *local_278;
  program *local_270;
  undefined1 *local_268;
  program local_258;
  program local_228;
  program local_1f8;
  program local_1c8;
  undefined1 local_1a0 [16];
  TestLog local_190 [13];
  ios_base local_128 [264];
  
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (bVar2) {
    lVar6 = 0x12;
    do {
      pRVar4 = deqp::Context::createSharedContext
                         ((this->super_TestCase).m_context,0,
                          RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED);
      *(RenderContext **)(this->m_program_pipelines + lVar6 * 2 + -0x1e) = pRVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x16);
    pStack_2b8.m_context = (this->super_TestCase).m_context;
    pStack_2b8.m_tesselation_control_shader_id = 0;
    pStack_2b8.m_tesselation_evaluation_shader_id = 0;
    pStack_2b8.m_vertex_shader_id = 0;
    pStack_2b8.m_compute_shader_id = 0;
    pStack_2b8.m_fragment_shader_id = 0;
    pStack_2b8.m_geometry_shader_id = 0;
    pStack_2b8.m_program_object_id = 0;
    local_288 = &pStack_2b8;
    prepareProgram(this,&local_288,false);
    pppVar5 = &local_288;
    bVar2 = testProgram(this,pppVar5,false,iterate::test_cases,10);
    if (!bVar2) {
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Last error message was caused by monolithic program.",0x34);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pppVar5 = (program **)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
    }
    Utils::program::remove(&pStack_2b8,(char *)pppVar5);
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_ARB_separate_shader_objects");
    if (bVar3) {
      pStack_2b8.m_context = (this->super_TestCase).m_context;
      pStack_2b8.m_tesselation_control_shader_id = 0;
      pStack_2b8.m_tesselation_evaluation_shader_id = 0;
      pStack_2b8.m_vertex_shader_id = 0;
      pStack_2b8.m_compute_shader_id = 0;
      pStack_2b8.m_fragment_shader_id = 0;
      pStack_2b8.m_geometry_shader_id = 0;
      pStack_2b8.m_program_object_id = 0;
      local_278 = &local_1c8;
      local_1c8.m_tesselation_control_shader_id = 0;
      local_1c8.m_tesselation_evaluation_shader_id = 0;
      local_1c8.m_vertex_shader_id = 0;
      local_1c8.m_compute_shader_id = 0;
      local_1c8.m_fragment_shader_id = 0;
      local_1c8.m_geometry_shader_id = 0;
      local_1c8.m_program_object_id = 0;
      local_270 = &local_1f8;
      local_1f8.m_tesselation_control_shader_id = 0;
      local_1f8.m_tesselation_evaluation_shader_id = 0;
      local_1f8.m_vertex_shader_id = 0;
      local_1f8.m_compute_shader_id = 0;
      local_1f8.m_fragment_shader_id = 0;
      local_1f8.m_geometry_shader_id = 0;
      local_1f8.m_program_object_id = 0;
      local_280 = &local_228;
      local_228.m_tesselation_control_shader_id = 0;
      local_228.m_tesselation_evaluation_shader_id = 0;
      local_228.m_vertex_shader_id = 0;
      local_228.m_compute_shader_id = 0;
      local_228.m_fragment_shader_id = 0;
      local_228.m_geometry_shader_id = 0;
      local_228.m_program_object_id = 0;
      local_288 = &local_258;
      local_258.m_tesselation_control_shader_id = 0;
      local_258.m_tesselation_evaluation_shader_id = 0;
      local_258.m_vertex_shader_id = 0;
      local_258.m_compute_shader_id = 0;
      local_258.m_fragment_shader_id = 0;
      local_258.m_geometry_shader_id = 0;
      local_258.m_program_object_id = 0;
      local_268 = (undefined1 *)&pStack_2b8;
      local_258.m_context = pStack_2b8.m_context;
      local_228.m_context = pStack_2b8.m_context;
      local_1f8.m_context = pStack_2b8.m_context;
      local_1c8.m_context = pStack_2b8.m_context;
      prepareProgram(this,&local_288,true);
      pppVar5 = &local_288;
      bVar3 = testProgram(this,pppVar5,true,iterate::test_cases,10);
      if (!bVar3) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        poVar1 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Last error message was caused by separable program.",0x33);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        pppVar5 = (program **)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_128);
      }
      bVar2 = bVar3 && bVar2;
      Utils::program::remove(&local_258,(char *)pppVar5);
      Utils::program::remove(&local_228,(char *)pppVar5);
      Utils::program::remove(&local_1f8,(char *)pppVar5);
      Utils::program::remove(&local_1c8,(char *)pppVar5);
      Utils::program::remove(&pStack_2b8,(char *)pppVar5);
    }
    if (!bVar2) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar2,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_1a0._0_8_ = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"GL_ARB_shader_subroutine is not supported.","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_1a0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest20_21::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Test cases, values stored here are used as bit fields */
	static const GLuint test_cases[][m_n_shared_contexts + 1] = {
		{ 0, 1, 2, 3, 4 },		{ 1, 2, 3, 4, 0 },		{ 2, 3, 4, 0, 1 },		{ 3, 4, 0, 1, 2 },
		{ 4, 0, 1, 2, 3 },		{ 27, 28, 29, 30, 31 }, { 28, 29, 30, 31, 27 }, { 29, 30, 31, 27, 28 },
		{ 30, 31, 27, 28, 29 }, { 31, 27, 28, 29, 30 },
	};
	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Prepare contexts */
	initSharedContexts();

	/* Test result */
	bool result = true;

	/* Program pointers */
	Utils::program* program_pointers[5];

	/* Test monolithic program */
	{
		/* Prepare program */
		Utils::program program(m_context);

		program_pointers[m_fragment_stage_index] = &program;

		prepareProgram(program_pointers, false);

		/* Execute test */
		if (false == testProgram(program_pointers, false, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by monolithic program."
												<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Test separable programs */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		/* Prepare programs */
		Utils::program vertex_program(m_context);
		Utils::program tesselation_control_program(m_context);
		Utils::program tesselation_evaluation_program(m_context);
		Utils::program geometry_program(m_context);
		Utils::program fragment_program(m_context);

		program_pointers[m_fragment_stage_index]			   = &fragment_program;
		program_pointers[m_geometry_stage_index]			   = &geometry_program;
		program_pointers[m_tesselation_control_stage_index]	= &tesselation_control_program;
		program_pointers[m_tesselation_evaluation_stage_index] = &tesselation_evaluation_program;
		program_pointers[m_vertex_stage_index]				   = &vertex_program;

		prepareProgram(program_pointers, true);

		/* Execute test */
		if (false == testProgram(program_pointers, true, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by separable program."
												<< tcu::TestLog::EndMessage;
			result = false;
		}
	}

	/* All done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}